

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcold.c
# Opt level: O1

int ffpcnd(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          double *array,double nulvalue,int *status)

{
  uint uVar1;
  tcolumn *ptVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  LONGLONG LVar7;
  long lVar8;
  ulong nelem_00;
  long lVar9;
  long lVar10;
  double *pdVar11;
  ulong nelem_01;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4))
    goto LAB_0019c1d2;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ptVar2 = fptr->Fptr->tableptr;
  uVar1 = ptVar2[(long)colnum + -1].tdatatype;
  if ((int)uVar1 < 1) {
    LVar7 = firstelem + nelem + -1;
  }
  else {
    LVar7 = ptVar2[(long)colnum + -1].trepeat;
  }
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  lVar8 = LVar7 << (0x52 < uVar5);
  if (((int)uVar1 < 0) &&
     (iVar4 = ffpcld(fptr,colnum,firstrow,firstelem,nelem,array,status), 0 < iVar4)) {
    if (*status != 0x19c) {
      return *status;
    }
    *status = 0;
  }
  lVar9 = (firstrow + -1) * lVar8 + firstelem;
  bVar3 = 0;
  if (nelem < 1) {
    nelem_01 = 0;
    nelem_00 = 0;
    nelem = 0;
  }
  else {
    bVar3 = 0;
    nelem_00 = 0;
    nelem_01 = 0;
    LVar7 = nelem;
    lVar10 = lVar9;
    pdVar11 = array;
    do {
      if ((*pdVar11 != nulvalue) || (NAN(*pdVar11) || NAN(nulvalue))) {
        if ((nelem_00 != 0) &&
           (lVar6 = (long)(~nelem_00 + lVar10) / lVar8,
           iVar4 = ffpcluc(fptr,colnum,lVar6 + 1,(-lVar8 * lVar6 - nelem_00) + lVar10,nelem_00,
                           status), 0 < iVar4)) goto LAB_0019c1d2;
        nelem_01 = nelem_01 + 1;
        nelem_00 = 0;
      }
      else {
        if ((nelem_01 != 0 && 0 < (int)uVar1) &&
           (lVar6 = (long)(~nelem_01 + lVar10) / lVar8,
           iVar4 = ffpcld(fptr,colnum,lVar6 + 1,(-lVar8 * lVar6 - nelem_01) + lVar10,nelem_01,
                          pdVar11 + -nelem_01,status), 0 < iVar4)) {
          if (*status != 0x19c) {
            return *status;
          }
          *status = 0;
          bVar3 = 1;
        }
        nelem_00 = nelem_00 + 1;
        nelem_01 = 0;
      }
      pdVar11 = pdVar11 + 1;
      lVar10 = lVar10 + 1;
      LVar7 = LVar7 + -1;
    } while (LVar7 != 0);
  }
  if (nelem_01 == 0) {
    if (nelem_00 != 0) {
      lVar10 = (long)((nelem - nelem_00) + lVar9 + -1) / lVar8;
      ffpcluc(fptr,colnum,lVar10 + 1,((nelem - nelem_00) + lVar9) - lVar10 * lVar8,nelem_00,status);
    }
  }
  else if (0 < (int)uVar1) {
    lVar6 = nelem - nelem_01;
    lVar10 = (lVar6 + lVar9 + -1) / lVar8;
    ffpcld(fptr,colnum,lVar10 + 1,(lVar6 + lVar9) - lVar8 * lVar10,nelem_01,array + lVar6,status);
  }
  if ((bool)(*status < 1 & bVar3)) {
    *status = 0x19c;
  }
LAB_0019c1d2:
  return *status;
}

Assistant:

int ffpcnd( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            double *array,   /* I - array of values to write                */
            double nulvalue, /* I - value used to flag undefined pixels     */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels equal to the value of nulvalue will be replaced by the appropriate
  null value in the output FITS file. 

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary
*/
{
    tcolumn *colptr;
    LONGLONG  ngood = 0, nbad = 0, ii;
    LONGLONG repeat, first, fstelm, fstrow;
    int tcode, overflow = 0;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode  = colptr->tdatatype;

    if (tcode > 0)
       repeat = colptr->trepeat;  /* repeat count for this column */
    else
       repeat = firstelem -1 + nelem;  /* variable length arrays */

    if (abs(tcode) >= TCOMPLEX)
    { /* treat complex columns as pairs of numbers */
        repeat *= 2;
    }

    /* if variable length array, first write the whole input vector, 
       then go back and fill in the nulls */
    if (tcode < 0) {
      if (ffpcld(fptr, colnum, firstrow, firstelem, nelem, array, status) > 0) {
	if (*status == NUM_OVERFLOW) 
	{
	  /* ignore overflows, which are possibly the null pixel values */
	  /*  overflow = 1;   */
	  *status = 0;
	} else { 
          return(*status);
	}
      }
    }

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (array[ii] != nulvalue)  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            /* call ffpcluc, not ffpclu, in case we are writing to a
	       complex ('C') binary table column */
            if (ffpcluc(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);

            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (tcode > 0) {  /* variable length arrays have already been written */
              if (ffpcld(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0) {
		if (*status == NUM_OVERFLOW) 
		{
		  overflow = 1;
		  *status = 0;
		} else {
                  return(*status);
		}
	      }
            }
            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      if (tcode > 0) {  /* variable length arrays have already been written */
        ffpcld(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
      }
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */
      ffpcluc(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    if (*status <= 0) {
      if (overflow) {
        *status = NUM_OVERFLOW;
      }
    }

    return(*status);
}